

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::ADC_ZP(CPU *this)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  uint16_t sum;
  uint8_t op;
  uint8_t acp;
  CPU *this_local;
  
  this->cycles = 3;
  bVar1 = this->A;
  bVar2 = GetByte(this);
  bVar2 = ReadByte(this,(ushort)bVar2);
  uVar3 = (ushort)this->A + (ushort)bVar2 + (ushort)((this->field_6).ps & 1);
  this->A = (uint8_t)uVar3;
  (this->field_6).ps =
       (this->field_6).ps & 0xfe | ((uVar3 & 0xff00) != 0 && -1 < (int)(uVar3 & 0xff00));
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  if ((bVar1 & 0x80) == (bVar2 & 0x80)) {
    bVar4 = (this->A & 0x80) != (bVar1 & 0x80);
  }
  else {
    bVar4 = false;
  }
  (this->field_6).ps = (this->field_6).ps & 0xbf | bVar4 << 6;
  return;
}

Assistant:

void CPU::ADC_ZP()
{
    cycles = 3;
    uint8_t acp = A, op = ReadByte(GetByte());
    uint16_t sum = A + op + C;
    A = (sum & 0xFF);
    C = (sum & 0xFF00) > 0;
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
    V = (((acp & 0b10000000) ^ (op & 0b10000000)) == 0) ? (A & 0b10000000) != (acp & 0b10000000) : 0;
}